

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
dynet::Sparsemax::backward_dev_impl<dynet::Device_CPU>
          (Sparsemax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  uint uVar2;
  uint *puVar3;
  CoeffReturnType pfVar4;
  Scalar *pSVar5;
  int i_1;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  puVar3 = (uint *)(this->super_Node).aux_mem;
  uVar2 = *puVar3;
  Tensor::operator*(&local_70,dEdf);
  fVar8 = 0.0;
  uVar6 = (ulong)(~((int)uVar2 >> 0x1f) & uVar2);
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    pfVar4 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           *)&local_70,(long)(int)puVar3[uVar7 + 1],0);
    fVar8 = fVar8 + *pfVar4;
  }
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    pfVar4 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           *)&local_70,(long)(int)puVar3[uVar7 + 1],0);
    fVar1 = *pfVar4;
    Tensor::operator*(&local_50,dEdxi);
    pSVar5 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)&local_50,(long)(int)puVar3[uVar7 + 1],0);
    *pSVar5 = (fVar1 - fVar8 / (float)(int)uVar2) + *pSVar5;
  }
  return;
}

Assistant:

void Sparsemax::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
#ifdef __CUDACC__
  throw std::runtime_error("Sparsemax not implemented for CUDA");
#else
  const int ssize = static_cast<int*>(aux_mem)[0];
  int *support = static_cast<int*>(aux_mem) + 1;
  float dhat = 0;
  auto& d = *dEdf;
  for (int i = 0; i < ssize; ++i)
    dhat += d(support[i], 0);
  dhat /= ssize;
  for (int i = 0; i < ssize; ++i)
    (*dEdxi)(support[i], 0) += d(support[i], 0) - dhat;
#endif
}